

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int rank;
  pointer pcVar2;
  bool bVar3;
  LogMessage *other;
  Result *_result;
  string local_a8;
  string local_88;
  LogMessage local_68;
  
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    validateInputCount(__return_storage_ptr__,layer,0,0);
    bVar3 = Result::good(__return_storage_ptr__);
  }
  else {
    validateInputCount(__return_storage_ptr__,layer,1,3);
    bVar3 = Result::good(__return_storage_ptr__);
  }
  if (bVar3 != false) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3 != false) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              other = google::protobuf::internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
              google::protobuf::internal::LogMessage::~LogMessage(&local_68);
            }
            rank = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                  [0] + 0x24);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Range","");
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"output","");
            checkRank(__return_storage_ptr__,layer,&local_a8,1,1,&local_88,rank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    if (layer.input_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 3));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    }

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        HANDLE_RESULT_AND_RETURN_ON_ERROR(checkRank(layer, "Range", 1, 1, "output", rank));
    }

    return Result();
}